

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

timestamp_t __thiscall NeuralConsumer::getData(NeuralConsumer *this,int16_t *dest)

{
  pointer psVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  timestamp_t tVar6;
  
  psVar1 = (this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*(this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub[5])
            (this,psVar1,
             (long)(this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)psVar1);
  psVar1 = (this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  for (uVar5 = 1;
      (ulong)(uVar5 - 1) <
      (ulong)((long)(this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar2 >> 2); uVar5 = uVar5 + 2) {
    if ((long)piVar2[uVar5] == 0) {
      iVar3 = 0;
    }
    else {
      memmove(dest + iVar4,psVar1 + (long)piVar2[uVar5 - 1] + 2,(long)piVar2[uVar5] * 2);
      piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = piVar2[uVar5];
    }
    iVar4 = iVar4 + iVar3;
  }
  tVar6._4_4_ = 0;
  tVar6.trodes_timestamp =
       *(uint *)(this->tempinput).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start;
  tVar6.system_timestamp = (this->super_HFSubConsumer).lasttimestamp;
  return tVar6;
}

Assistant:

timestamp_t NeuralConsumer::getData(int16_t *dest){
    readData(tempinput.data(), tempinput.size()*sizeof(int16_t));
    int16_t *src = tempinput.data() + sizeof(uint32_t)/sizeof(int16_t); //timestamp is first
    int offset = 0;
//     for(const auto &i : args.indices){
//         //i is the ith channel. so i*sizeof(int16_t) is the offset after the first one.
// //        memcpy(dst+offset, src + i*sizeof(int16_t), sizeof(int16_t));
//         dest[offset] = *(int16_t*)(src+i*sizeof(int16_t));
//         offset++;
//     }
    for(unsigned int i = 0; i < args.indices.size(); i+=2){
        std::copy(src+args.indices[i], src+args.indices[i]+args.indices[i+1], dest+offset);
        offset += args.indices[i+1];
    }
    return {*(uint32_t*)tempinput.data(), lastSysTimestamp()}; //Timestamp at beginning of packet
}